

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O3

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                *objToStore,XSerializeEngine *serEng)

{
  XMLSize_t XVar1;
  RefHash3KeysTableBucketElem<xercesc_4_0::SchemaElementDecl> *pRVar2;
  bool bVar3;
  SchemaElementDecl *pSVar4;
  XMLSize_t XVar5;
  size_t __n;
  void *__buf;
  int key2;
  int key1;
  void *strkey;
  uint local_78;
  int local_74;
  RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> local_70;
  void *local_38;
  
  bVar3 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar3) {
    XSerializeEngine::writeSize(serEng,objToStore->fHashModulus);
    local_70.fMemoryManager = objToStore->fMemoryManager;
    local_70.super_XMLEnumerator<xercesc_4_0::SchemaElementDecl>._vptr_XMLEnumerator =
         (_func_int **)&PTR__RefHash3KeysIdPoolEnumerator_00407400;
    local_70.fAdoptedElems = false;
    local_70.fCurIndex = (XMLSize_t)(objToStore->fIdCounter != 0);
    local_70.fCurElem = (RefHash3KeysTableBucketElem<xercesc_4_0::SchemaElementDecl> *)0x0;
    local_70.fCurHash = 0;
    XVar1 = objToStore->fHashModulus;
    pRVar2 = local_70.fCurElem;
    if (XVar1 != 0) {
      pRVar2 = *objToStore->fBucketList;
      if (pRVar2 == (RefHash3KeysTableBucketElem<xercesc_4_0::SchemaElementDecl> *)0x0) {
        XVar5 = 0;
        do {
          pRVar2 = local_70.fCurElem;
          local_70.fCurHash = XVar1;
          if (XVar1 - 1 == XVar5) break;
          pRVar2 = objToStore->fBucketList[XVar5 + 1];
          XVar5 = XVar5 + 1;
          local_70.fCurHash = XVar5;
        } while (pRVar2 == (RefHash3KeysTableBucketElem<xercesc_4_0::SchemaElementDecl> *)0x0);
      }
      else {
        local_70.fCurHash = 0;
      }
    }
    local_70.fCurElem = pRVar2;
    local_70.fToEnum = objToStore;
    XSerializeEngine::writeSize(serEng,objToStore->fIdCounter);
    while ((local_70.fCurElem != (RefHash3KeysTableBucketElem<xercesc_4_0::SchemaElementDecl> *)0x0
           || (local_70.fCurHash != (local_70.fToEnum)->fHashModulus))) {
      RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
      nextElementKey(&local_70,&local_38,&local_74,(int *)&local_78);
      XSerializeEngine::operator<<(serEng,local_78);
      __n = (size_t)local_78;
      pSVar4 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
               getByKey(objToStore,local_38,local_74,local_78);
      XSerializeEngine::write(serEng,(int)pSVar4,__buf,__n);
    }
    RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
    ~RefHash3KeysIdPoolEnumerator(&local_70);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefHash3KeysIdPool<SchemaElementDecl>* const objToStore
                                    , XSerializeEngine&                            serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        serEng.writeSize (objToStore->getHashModulus());

        RefHash3KeysIdPoolEnumerator<SchemaElementDecl> e(objToStore, false, objToStore->getMemoryManager());

        serEng.writeSize (e.size());

        void*  strkey;
        int    key1;
        int    key2;
        /* Update to store key2 separately as for the putGroupElemDecl the key is not the
           enclosing scope but another value. */
        while (e.hasMoreKeys())
        {
            e.nextElementKey(strkey, key1, key2);
            serEng<<key2;
            SchemaElementDecl* data = objToStore->getByKey(strkey, key1, key2);
            serEng<<data;
        }
    }

}